

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O3

void __thiscall tl::StrT<char>::append(StrT<char> *this,CStrT<char> o)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  uint newSize;
  uint uVar4;
  
  uVar4 = o._size;
  newSize = this->_size + uVar4;
  pcVar2 = growIfNeeded(this,newSize);
  if (pcVar2 != (char *)0x0) {
    if (this->_size != 0) {
      uVar3 = 0;
      do {
        pcVar2[uVar3] = this->_str[uVar3];
        uVar3 = uVar3 + 1;
      } while (uVar3 < this->_size);
    }
    pcVar1 = this->_str;
    if (pcVar1 != (char *)0x0 && pcVar1 != &s_emptyStr<char>) {
      operator_delete__(pcVar1);
    }
    this->_str = pcVar2;
  }
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      this->_str[this->_size + (int)uVar3] = o._str[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar4 != uVar3);
  }
  this->_str[newSize] = '\0';
  this->_size = newSize;
  return;
}

Assistant:

void StrT<CharT>::append(CStrT<CharT> o)
{
    const u32 newSize = _size + o.size();
    CharT *const newStr = growIfNeeded(newSize);
    if(newStr) {
        for(u32 i=0; i<_size; i++) {
            newStr[i] = _str[i];
        }
        if(_str != s_emptyStr<CharT>) {
            delete[] _str;
        }
        _str = newStr;
    }
    for(u32 i=0; i<o.size(); i++) {
        _str[_size+i] = o[i];
    }
    _str[newSize] = 0;
    _size = newSize;
}